

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

T_INDEX __thiscall
Nova::Grid<float,_3>::Closest_Node(Grid<float,_3> *this,TV *X,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  TV TVar1;
  T_INDEX TVar2;
  Vector<float,_3,_true> data_copy_2;
  Vector<float,_3,_true> data_copy;
  Vector<float,_3,_true> data_copy_1;
  T_INDEX index;
  Range<int,_3> local_68;
  Vector<float,_3,_true> local_50;
  Vector<float,_3,_true> local_40;
  Vector<int,_3,_true> local_34;
  
  local_50._data._M_elems[2] = ((float *)CONCAT44(in_register_00000014,number_of_ghost_cells))[2];
  local_50._data._M_elems._0_8_ =
       *(undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells);
  Vector<float,_3,_true>::operator-=(&local_50,X + 1);
  local_40._data._M_elems[0] = local_50._data._M_elems[0];
  local_40._data._M_elems[1] = local_50._data._M_elems[1];
  local_40._data._M_elems[2] = local_50._data._M_elems[2];
  Vector<float,_3,_true>::operator*=(&local_40,X + 4);
  local_68.min_corner._data._M_elems[0] = (int)local_40._data._M_elems[0];
  local_68.min_corner._data._M_elems[1] = (int)local_40._data._M_elems[1];
  local_68.min_corner._data._M_elems[2] = (int)local_40._data._M_elems[2];
  Vector<float,_3,_true>::operator+=((Vector<float,_3,_true> *)&local_68,1.5);
  Vector<int,_3,_true>::Vector<float>(&local_34,(Vector<float,_3,_true> *)&local_68);
  Node_Indices(&local_68,(Grid<float,_3> *)X,in_ECX);
  TVar1 = Range<int,_3>::Clamp((Range<int,_3> *)this,&local_68.min_corner);
  TVar2._data._M_elems[2] = TVar1._data._M_elems[2];
  TVar2._data._M_elems._0_8_ = this;
  return (T_INDEX)TVar2._data._M_elems;
}

Assistant:

T_INDEX Closest_Node(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index((X-domain.min_corner)*one_over_dX+(T)1.5);
        return Node_Indices(number_of_ghost_cells).Clamp(index);
    }